

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisplayResource.cpp
# Opt level: O3

bool __thiscall DisplayResource::load(DisplayResource *this)

{
  ALLEGRO_DISPLAY *pAVar1;
  char *pcVar2;
  undefined8 uVar3;
  ALLEGRO_EVENT_QUEUE *pAVar4;
  
  al_set_new_display_flags(useFullScreenMode + 1);
  pAVar1 = (ALLEGRO_DISPLAY *)al_create_display(BB_W,BB_H);
  this->display = pAVar1;
  if (pAVar1 != (ALLEGRO_DISPLAY *)0x0) {
    pcVar2 = getResource("gfx/icon48.png");
    uVar3 = al_load_bitmap(pcVar2);
    al_set_display_icon(this->display,uVar3);
    al_destroy_bitmap(uVar3);
    BB_W = al_get_display_width(this->display);
    BB_H = al_get_display_height(this->display);
    pAVar4 = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
    this->events = pAVar4;
    uVar3 = al_get_display_event_source(this->display);
    al_register_event_source(pAVar4,uVar3);
  }
  return pAVar1 != (ALLEGRO_DISPLAY *)0x0;
}

Assistant:

bool DisplayResource::load(void)
{
#ifdef ALLEGRO_IPHONE
   int flags = ALLEGRO_FULLSCREEN_WINDOW;
   al_set_new_display_option(ALLEGRO_SUPPORTED_ORIENTATIONS, ALLEGRO_DISPLAY_ORIENTATION_LANDSCAPE, ALLEGRO_REQUIRE);
#else
   int flags = useFullScreenMode ? ALLEGRO_FULLSCREEN : ALLEGRO_WINDOWED;
#endif
   al_set_new_display_flags(flags);
   display = al_create_display(BB_W, BB_H);
   if (!display)
       return false;

#ifndef ALLEGRO_IPHONE
   ALLEGRO_BITMAP *bmp = al_load_bitmap(getResource("gfx/icon48.png"));
   al_set_display_icon(display, bmp);
   al_destroy_bitmap(bmp);
#endif

   BB_W = al_get_display_width(display);
   BB_H = al_get_display_height(display);
   
#ifdef ALLEGRO_IPHONE
   if (BB_W < 960) {
	BB_W *= 2;
	BB_H *= 2;
	ALLEGRO_TRANSFORM t;
	al_identity_transform(&t);
	al_scale_transform(&t, 0.5, 0.5);
	al_use_transform(&t);
   }
#endif
      
   events = al_create_event_queue();
   al_register_event_source(events, al_get_display_event_source(display));

   return true;
}